

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O1

uint8 * __thiscall
sentencepiece::SelfTestData::_InternalSerialize
          (SelfTestData *this,uint8 *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  bool bVar4;
  Type *this_00;
  uint uVar5;
  uint uVar6;
  int index;
  undefined8 *puVar7;
  size_t __n;
  uint8 *puVar8;
  uint8 *puVar9;
  
  iVar1 = (this->samples_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    index = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<sentencepiece::SelfTestData_Sample>::TypeHandler>
                          (&(this->samples_).super_RepeatedPtrFieldBase,index);
      *target = '\n';
      uVar5 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar5 < 0x80) {
        target[1] = (byte)uVar5;
        puVar8 = target + 2;
      }
      else {
        target[1] = (byte)uVar5 | 0x80;
        if (uVar5 < 0x4000) {
          target[2] = (uint8)(uVar5 >> 7);
          puVar8 = target + 3;
        }
        else {
          puVar8 = target + 3;
          uVar5 = uVar5 >> 7;
          do {
            puVar9 = puVar8;
            puVar9[-1] = (byte)uVar5 | 0x80;
            uVar6 = uVar5 >> 7;
            puVar8 = puVar9 + 1;
            bVar4 = 0x3fff < uVar5;
            uVar5 = uVar6;
          } while (bVar4);
          *puVar9 = (uint8)uVar6;
        }
      }
      target = SelfTestData_Sample::_InternalSerialize(this_00,puVar8,stream);
      index = index + 1;
    } while (index != iVar1);
  }
  puVar8 = google::protobuf::internal::ExtensionSet::_InternalSerialize
                     (&this->_extensions_,200,0x20000000,target,stream);
  pvVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    pvVar2 = *(void **)(((ulong)pvVar2 & 0xfffffffffffffffe) + 8);
    pvVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)pvVar3 & 1) == 0) {
      puVar7 = &google::protobuf::internal::fixed_address_empty_string;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar7 = (undefined8 *)(((ulong)pvVar3 & 0xfffffffffffffffe) + 8);
    }
    __n = (size_t)(int)puVar7[1];
    if ((long)stream->end_ - (long)puVar8 < (long)__n) {
      puVar8 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,pvVar2,(int)puVar7[1],puVar8);
      return puVar8;
    }
    memcpy(puVar8,pvVar2,__n);
    puVar8 = puVar8 + __n;
  }
  return puVar8;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* SelfTestData::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:sentencepiece.SelfTestData)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .sentencepiece.SelfTestData.Sample samples = 1;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_samples_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(1, this->_internal_samples(i), target, stream);
  }

  // Extension range [200, 536870912)
  target = _extensions_._InternalSerialize(
      200, 536870912, target, stream);

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:sentencepiece.SelfTestData)
  return target;
}